

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O0

void __thiscall
Qentem::QTest::PrintErrorMessage<Qentem::StringStream<char16_t>,char16_t[32]>
          (QTest *this,bool equal,StringStream<char16_t> *value1,char16_t (*value2) [32],
          unsigned_long line)

{
  char *local_58;
  char local_49;
  char *local_48;
  char *local_40;
  unsigned_long local_38;
  unsigned_long line_local;
  char16_t (*value2_local) [32];
  StringStream<char16_t> *value1_local;
  QTest *pQStack_18;
  bool equal_local;
  QTest *this_local;
  
  local_38 = line;
  line_local = (unsigned_long)value2;
  value2_local = (char16_t (*) [32])value1;
  value1_local._7_1_ = equal;
  pQStack_18 = this;
  local_40 = TestOutPut::GetColor(ERROR);
  local_48 = TestOutPut::GetColor(END);
  local_49 = '\n';
  TestOutPut::Print<char_const*,char[7],char_const*,char[3],char_const*,char>
            (&local_40,(char (*) [7])"Failed",&local_48,(char (*) [3])0x12f632,&this->part_name_,
             &local_49);
  local_58 = " ";
  if ((value1_local._7_1_ & 1) != 0) {
    local_58 = " not ";
  }
  TestOutPut::
  Print<char_const*,char[2],unsigned_long,char[10],char_const*,char[9],char16_t[32],char[19],Qentem::StringStream<char16_t>,char[4]>
            (&this->file_fullname_,(char (*) [2])":",&local_38,(char (*) [10])":\n Should",&local_58
             ,(char (*) [9])"equal: `",(char16_t (*) [32])line_local,
             (char (*) [19])"`\n     Returned: `",(StringStream<char16_t> *)value2_local,
             (char (*) [4])"`\n\n");
  return;
}

Assistant:

QENTEM_NOINLINE void PrintErrorMessage(bool equal, const Value1_T &value1, const Value2_T &value2,
                                           unsigned long line) {
        TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::ERROR), "Failed",
                          TestOutPut::GetColor(TestOutPut::Colors::END), ": ", part_name_, '\n');
        TestOutPut::Print(file_fullname_, ":", line, ":\n Should", (equal ? " not " : " "), "equal: `", value2,
                          "`\n     Returned: `", value1, "`\n\n");
    }